

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
* processRequestParameters_abi_cxx11_
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
             *__return_storage_ptr__,string_view target,string_view body)

{
  size_t sVar1;
  pointer pbVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  bool bVar4;
  char __c;
  size_type sVar5;
  reference pbVar6;
  string_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong uVar8;
  mapped_type *this_00;
  char *pcVar9;
  size_t ii;
  pointer this_01;
  ulong uVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  string_view jsonString;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  string_view local_198;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parameters;
  array<char,_3UL> exp;
  undefined1 auStack_165 [13];
  json val;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __begin3;
  iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_a8;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __end3;
  
  local_1a8._M_str = target._M_str;
  local_1a8._M_len = target._M_len;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->first)._M_len = 0;
  (__return_storage_ptr__->first)._M_str = (char *)0x0;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  local_198 = body;
  sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_1a8,'?',0);
  if (sVar5 == 0xffffffffffffffff) {
    (__return_storage_ptr__->first)._M_len = local_1a8._M_len;
    (__return_storage_ptr__->first)._M_str = local_1a8._M_str;
    local_1a8 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  }
  else {
    bVar11 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_1a8,0,sVar5);
    __return_storage_ptr__->first = bVar11;
    local_1a8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_1a8,sVar5 + 1,0xffffffffffffffff);
  }
  sVar1 = (__return_storage_ptr__->first)._M_len;
  if ((sVar1 != 0) && (pcVar9 = (__return_storage_ptr__->first)._M_str, *pcVar9 == '/')) {
    (__return_storage_ptr__->first)._M_str = pcVar9 + 1;
    (__return_storage_ptr__->first)._M_len = sVar1 - 1;
  }
  parameters.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parameters.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_1a8._M_len != 0) {
    sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_1a8,'&',0);
    while (sVar5 != 0xffffffffffffffff) {
      __begin3.anchor._0_16_ =
           CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_1a8,0,sVar5);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&parameters,(basic_string_view<char,_std::char_traits<char>_> *)&__begin3);
      local_1a8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&local_1a8,sVar5 + 1,0xffffffffffffffff);
      sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_1a8,'&',0);
    }
    if (local_1a8._M_len != 0) {
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(&parameters,&local_1a8);
    }
  }
  if ((char *)local_198._M_len != (char *)0x0) {
    if (*local_198._M_str == '{') {
      jsonString._M_str = (char *)local_198._M_len;
      jsonString._M_len = (size_t)&val;
      helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
      local_a8.container = &val;
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::begin(&__begin3,&local_a8);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::end(&__end3,&local_a8);
      while( true ) {
        bVar4 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&__begin3.anchor,&__end3.anchor);
        if (!bVar4) break;
        pbVar6 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*(&__begin3.anchor);
        if ((pbVar6->m_data).m_type == string) {
          pbVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&__begin3.anchor);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)&exp,pbVar6);
          psVar7 = nlohmann::json_abi_v3_11_3::detail::
                   iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   ::key(&__begin3);
          this = boost::container::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 ::priv_subscript(&__return_storage_ptr__->second,psVar7);
        }
        else {
          pbVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&__begin3.anchor);
          helics::fileops::generateJsonString((string *)&exp,pbVar6,true);
          psVar7 = nlohmann::json_abi_v3_11_3::detail::
                   iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   ::key(&__begin3);
          this = boost::container::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 ::priv_subscript(&__return_storage_ptr__->second,psVar7);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp);
        std::__cxx11::string::~string((string *)&exp);
        nlohmann::json_abi_v3_11_3::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        ::operator++(&__begin3);
      }
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value(&__end3);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value(&__begin3);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&val.m_data);
    }
    else {
      sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_198,'&',0);
      while (sVar5 != 0xffffffffffffffff) {
        __begin3.anchor._0_16_ =
             CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_198,0,sVar5);
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&parameters,(basic_string_view<char,_std::char_traits<char>_> *)&__begin3);
        local_198 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                              (&local_198,sVar5 + 1,0xffffffffffffffff);
        sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(&local_198,'&',0);
      }
      if (local_198._M_len != 0) {
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back(&parameters,&local_198);
      }
    }
  }
  pbVar2 = parameters.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = parameters.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pbVar2; this_01 = this_01 + 1
      ) {
    sVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find(this_01,'=',0);
    bVar11 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (this_01,sVar5 + 1,0xffffffffffffffff);
    pcVar9 = bVar11._M_str;
    __begin3.anchor.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    __begin3.anchor.m_object = (pointer)&__begin3.anchor.m_it.array_iterator;
    __begin3.anchor.m_it.array_iterator._M_current._0_1_ = 0;
    for (uVar10 = 0; bVar3 = _exp, uVar10 < bVar11._M_len; uVar10 = uVar10 + 1) {
      __c = pcVar9[uVar10];
      if (__c == '%') {
        exp._M_elems[1] = pcVar9[uVar10 + 2];
        exp._M_elems[0] = pcVar9[uVar10 + 1];
        auStack_165 = bVar3._3_13_;
        exp._M_elems[2] = '\0';
        __end3.anchor.m_object = (pointer)0x0;
        uVar8 = strtoul((char *)&exp,(char **)&__end3,0x10);
        if ((long)__end3.anchor.m_object - (long)&exp < 2) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
                    pcVar9[uVar10]);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,
                    (char)uVar8);
          uVar10 = uVar10 + 2;
        }
      }
      else {
        if (__c == '+') {
          __c = ' ';
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3,__c
                 );
      }
    }
    _exp = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr(this_01,0,sVar5);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&__end3,(basic_string_view<char,_std::char_traits<char>_> *)&exp,
               (allocator<char> *)&val);
    this_00 = boost::container::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              ::priv_subscript(&__return_storage_ptr__->second,(key_type *)&__end3);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin3);
    std::__cxx11::string::~string((string *)&__end3);
    std::__cxx11::string::~string((string *)&__begin3);
  }
  CLI::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&parameters.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string_view, boost::container::flat_map<std::string, std::string>>
    processRequestParameters(std::string_view target, std::string_view body)
{
    std::pair<std::string_view, boost::container::flat_map<std::string, std::string>> results;
    auto param_mark = target.find('?');
    if (param_mark != std::string_view::npos) {
        results.first = target.substr(0, param_mark);
        target = target.substr(param_mark + 1);
    } else {
        results.first = target;
        target = std::string_view{};
    }
    if (!results.first.empty() && results.first.front() == '/') {
        results.first.remove_prefix(1);
    }

    std::vector<std::string_view> parameters;
    if (!target.empty()) {
        auto splitloc = target.find_first_of('&');
        while (splitloc != std::string_view::npos) {
            parameters.push_back(target.substr(0, splitloc));
            target = target.substr(splitloc + 1);
            splitloc = target.find_first_of('&');
        }
        if (!target.empty()) {
            parameters.push_back(target);
        }
    }
    if (!body.empty()) {
        if (body.front() == '{') {
            nlohmann::json val = helics::fileops::loadJsonStr(body);
            for (const auto& value : val.items()) {
                if (value.value().is_string()) {
                    results.second[value.key()] = value.value().get<std::string>();
                } else {
                    results.second[value.key()] =
                        helics::fileops::generateJsonString(value.value());
                }
            }
        } else {
            auto splitloc = body.find_first_of('&');
            while (splitloc != std::string_view::npos) {
                parameters.push_back(body.substr(0, splitloc));
                body = body.substr(splitloc + 1);
                splitloc = body.find_first_of('&');
            }
            if (!body.empty()) {
                parameters.push_back(body);
            }
        }
    }

    for (auto& param : parameters) {
        auto eq_loc = param.find_first_of('=');
        results.second[std::string{param.substr(0, eq_loc)}] = uriDecode(param.substr(eq_loc + 1));
    }
    return results;
}